

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::ConsoleReporter::printClosedHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  size_t sVar2;
  
  printOpenHeader(this,_name);
  poVar1 = (this->super_StreamingReporterBase).stream;
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam00000000001be7b0 = 0x2e2e2e2e2e2e2e;
    uRam00000000001be7b7 = 0x2e2e2e2e2e2e2e2e;
    _DAT_001be7a0 = 0x2e2e2e2e2e2e2e2e;
    uRam00000000001be7a8 = 0x2e2e2e2e2e2e2e;
    DAT_001be7af = 0x2e;
    _DAT_001be790 = 0x2e2e2e2e2e2e2e2e;
    uRam00000000001be798 = 0x2e2e2e2e2e2e2e2e;
    _DAT_001be780 = 0x2e2e2e2e2e2e2e2e;
    uRam00000000001be788 = 0x2e2e2e2e2e2e2e2e;
    _line = 0x2e2e2e2e2e2e2e2e;
    uRam00000000001be778 = 0x2e2e2e2e2e2e2e2e;
    DAT_001be7bf = 0;
  }
  sVar2 = strlen(&getLineOfChars<(char)46>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)46>()::line,sVar2)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  return;
}

Assistant:

void printClosedHeader( std::string const& _name ) {
            printOpenHeader( _name );
            stream << getLineOfChars<'.'>() << "\n";
        }